

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

int s2pred::TriageCompareSin2Distances<double>
              (Vector3<double> *x,Vector3<double> *a,Vector3<double> *b)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar6 = a->c_[0] - x->c_[0];
  dVar7 = a->c_[1] - x->c_[1];
  dVar3 = a->c_[2] - x->c_[2];
  dVar4 = a->c_[0] + x->c_[0];
  dVar2 = a->c_[1] + x->c_[1];
  dVar5 = a->c_[2] + x->c_[2];
  dVar8 = dVar7 * dVar5 - dVar2 * dVar3;
  dVar3 = dVar3 * dVar4 - dVar5 * dVar6;
  dVar2 = dVar2 * dVar6 - dVar4 * dVar7;
  dVar3 = (dVar2 * dVar2 + dVar3 * dVar3 + dVar8 * dVar8) * 0.25;
  if (dVar3 < 0.0) {
    dVar2 = sqrt(dVar3);
  }
  else {
    dVar2 = SQRT(dVar3);
  }
  dVar7 = b->c_[0] - x->c_[0];
  dVar8 = b->c_[1] - x->c_[1];
  dVar4 = b->c_[2] - x->c_[2];
  dVar5 = b->c_[0] + x->c_[0];
  dVar10 = b->c_[1] + x->c_[1];
  dVar6 = b->c_[2] + x->c_[2];
  dVar9 = dVar8 * dVar6 - dVar10 * dVar4;
  dVar4 = dVar4 * dVar5 - dVar6 * dVar7;
  dVar5 = dVar10 * dVar7 - dVar5 * dVar8;
  dVar4 = (dVar5 * dVar5 + dVar4 * dVar4 + dVar9 * dVar9) * 0.25;
  if (dVar4 < 0.0) {
    dVar5 = sqrt(dVar4);
  }
  else {
    dVar5 = SQRT(dVar4);
  }
  dVar2 = dVar2 * 6.831735839737845e-31 + dVar3 * 3.100653426266254e-15 + 1.166815364598964e-61 +
          dVar5 * 6.831735839737845e-31 + dVar4 * 3.100653426266254e-15 + 1.166815364598964e-61;
  iVar1 = 1;
  if (dVar3 - dVar4 <= dVar2) {
    iVar1 = -(uint)(dVar3 - dVar4 < -dVar2);
  }
  return iVar1;
}

Assistant:

int TriageCompareSin2Distances(const Vector3<T>& x,
                               const Vector3<T>& a, const Vector3<T>& b) {
  T sin2_ax_error, sin2_bx_error;
  T sin2_ax = GetSin2Distance(a, x, &sin2_ax_error);
  T sin2_bx = GetSin2Distance(b, x, &sin2_bx_error);
  T diff = sin2_ax - sin2_bx;
  T error = sin2_ax_error + sin2_bx_error;
  return (diff > error) ? 1 : (diff < -error) ? -1 : 0;
}